

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone_motion::xr_bone_motion(xr_bone_motion *this)

{
  xr_envelope *local_18;
  xr_bone_motion *local_10;
  xr_bone_motion *this_local;
  
  this->_vptr_xr_bone_motion = (_func_int **)&PTR__xr_bone_motion_0038e228;
  local_10 = this;
  std::__cxx11::string::string((string *)&this->m_name);
  this->m_flags = '\0';
  local_18 = (xr_envelope *)0x0;
  std::uninitialized_fill_n<xray_re::xr_envelope**,unsigned_long,xray_re::xr_envelope*>
            (this->m_envelopes,6,&local_18);
  return;
}

Assistant:

xr_bone_motion::xr_bone_motion(): m_flags(0)
{
	std::uninitialized_fill_n(m_envelopes, xr_dim(m_envelopes), static_cast<xr_envelope*>(0));
}